

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SpiAnalyzer.cpp
# Opt level: O2

void __thiscall SpiAnalyzer::GetWord(SpiAnalyzer *this)

{
  U32 UVar1;
  SpiAnalyzerSettings *pSVar2;
  pointer puVar3;
  pointer puVar4;
  SpiAnalyzerResults *pSVar5;
  bool bVar6;
  bool bVar7;
  U64 UVar8;
  int iVar9;
  BitState BVar10;
  int iVar12;
  ulong uVar13;
  FrameV2 framev2;
  ulonglong local_b0;
  FrameV2 frame_v2_end_of_transaction;
  U64 disable_event_sample;
  U64 miso_word;
  U64 mosi_word;
  ulong local_70;
  U8 miso_bytearray [8];
  U8 mosi_bytearray [8];
  Frame result_frame;
  BitState BVar11;
  
  pSVar2 = (this->mSettings)._M_ptr;
  UVar1 = pSVar2->mBitsPerTransfer;
  mosi_word = 0;
  DataBuilder::Reset((ulonglong *)&this->mMosiResult,(ShiftOrder)&mosi_word,pSVar2->mShiftOrder);
  miso_word = 0;
  DataBuilder::Reset((ulonglong *)&this->mMisoResult,(ShiftOrder)&miso_word,
                     ((this->mSettings)._M_ptr)->mShiftOrder);
  disable_event_sample = 0;
  puVar3 = (this->mArrowLocations).
           super__Vector_base<unsigned_long_long,_std::allocator<unsigned_long_long>_>._M_impl.
           super__Vector_impl_data._M_start;
  if ((this->mArrowLocations).
      super__Vector_base<unsigned_long_long,_std::allocator<unsigned_long_long>_>._M_impl.
      super__Vector_impl_data._M_finish != puVar3) {
    (this->mArrowLocations).
    super__Vector_base<unsigned_long_long,_std::allocator<unsigned_long_long>_>._M_impl.
    super__Vector_impl_data._M_finish = puVar3;
  }
  local_70 = (ulong)(UVar1 + 7 >> 3);
  AnalyzerChannelData::GetSampleNumber();
  Analyzer::ReportProgress((ulonglong)this);
  iVar12 = 0;
  local_b0 = 0;
  do {
    iVar9 = UVar1 + iVar12;
    if (iVar9 == 0) {
LAB_001072cf:
      bVar6 = false;
LAB_001072d1:
      puVar3 = (this->mArrowLocations).
               super__Vector_base<unsigned_long_long,_std::allocator<unsigned_long_long>_>._M_impl.
               super__Vector_impl_data._M_finish;
      puVar4 = (this->mArrowLocations).
               super__Vector_base<unsigned_long_long,_std::allocator<unsigned_long_long>_>._M_impl.
               super__Vector_impl_data._M_start;
      for (uVar13 = 0; ((ulong)((long)puVar3 - (long)puVar4) >> 3 & 0xffffffff) != uVar13;
          uVar13 = uVar13 + 1) {
        AnalyzerResults::AddMarker
                  ((ulonglong)(this->mResults)._M_ptr,
                   (MarkerType)
                   (this->mArrowLocations).
                   super__Vector_base<unsigned_long_long,_std::allocator<unsigned_long_long>_>.
                   _M_impl.super__Vector_impl_data._M_start[uVar13],
                   (Channel *)(ulong)this->mArrowMarker);
      }
      Frame::Frame(&result_frame);
      _result_frame = local_b0;
      AnalyzerChannelData::GetSampleNumber();
      AnalyzerResults::AddFrame((Frame *)(this->mResults)._M_ptr);
      FrameV2::FrameV2(&framev2);
      iVar12 = (int)local_70 * 8;
      for (uVar13 = 0; iVar12 = iVar12 + -8, (local_70 & 0xffffffff) != uVar13; uVar13 = uVar13 + 1)
      {
        mosi_bytearray[uVar13] = (U8)(mosi_word >> ((byte)iVar12 & 0x3f));
        miso_bytearray[uVar13] = (U8)(miso_word >> ((byte)iVar12 & 0x3f));
      }
      FrameV2::AddByteArray((char *)&framev2,(uchar *)"mosi",(ulonglong)mosi_bytearray);
      FrameV2::AddByteArray((char *)&framev2,(uchar *)"miso",(ulonglong)miso_bytearray);
      pSVar5 = (this->mResults)._M_ptr;
      AnalyzerChannelData::GetSampleNumber();
      AnalyzerResults::AddFrameV2((FrameV2 *)pSVar5,(char *)&framev2,0x10a017,local_b0);
      AnalyzerResults::CommitResults();
      if (bVar6) {
        FrameV2::FrameV2(&frame_v2_end_of_transaction);
        AnalyzerResults::AddFrameV2
                  ((FrameV2 *)(this->mResults)._M_ptr,(char *)&frame_v2_end_of_transaction,0x10a01e,
                   disable_event_sample);
        AdvanceToActiveEnableEdgeWithCorrectClockPolarity(this);
        FrameV2::~FrameV2(&frame_v2_end_of_transaction);
      }
      FrameV2::~FrameV2(&framev2);
      Frame::~Frame(&result_frame);
      return;
    }
    if (iVar12 == 0) {
      Analyzer::CheckIfThreadShouldExit();
    }
    bVar6 = WouldAdvancingTheClockToggleEnable(this,true,(U64 *)0x0);
    if (bVar6) {
LAB_001072a0:
      AdvanceToActiveEnableEdgeWithCorrectClockPolarity(this);
      return;
    }
    AnalyzerChannelData::AdvanceToNextEdge();
    bVar6 = iVar12 == 0;
    iVar12 = iVar12 + -1;
    if (bVar6) {
      local_b0 = AnalyzerChannelData::GetSampleNumber();
    }
    BVar10 = (BitState)&this->mMosiResult;
    BVar11 = (BitState)&this->mMisoResult;
    if (((this->mSettings)._M_ptr)->mDataValidEdge == LeadingEdge) {
      UVar8 = AnalyzerChannelData::GetSampleNumber();
      this->mCurrentSample = UVar8;
      if (this->mMosi != (AnalyzerChannelData *)0x0) {
        AnalyzerChannelData::AdvanceToAbsPosition((ulonglong)this->mMosi);
        AnalyzerChannelData::GetBitState();
        DataBuilder::AddBit(BVar10);
      }
      if (this->mMiso != (AnalyzerChannelData *)0x0) {
        AnalyzerChannelData::AdvanceToAbsPosition((ulonglong)this->mMiso);
        AnalyzerChannelData::GetBitState();
        DataBuilder::AddBit(BVar11);
      }
      std::vector<unsigned_long_long,_std::allocator<unsigned_long_long>_>::push_back
                (&this->mArrowLocations,&this->mCurrentSample);
    }
    if ((iVar9 == 1) && (((this->mSettings)._M_ptr)->mDataValidEdge != TrailingEdge)) {
      bVar7 = WouldAdvancingTheClockToggleEnable(this,false,&disable_event_sample);
      bVar6 = true;
      if (bVar7) goto LAB_001072d1;
      AnalyzerChannelData::AdvanceToNextEdge();
      goto LAB_001072cf;
    }
    bVar6 = WouldAdvancingTheClockToggleEnable(this,true,(U64 *)0x0);
    if (bVar6) goto LAB_001072a0;
    AnalyzerChannelData::AdvanceToNextEdge();
    if (((this->mSettings)._M_ptr)->mDataValidEdge == TrailingEdge) {
      UVar8 = AnalyzerChannelData::GetSampleNumber();
      this->mCurrentSample = UVar8;
      if (this->mMosi != (AnalyzerChannelData *)0x0) {
        AnalyzerChannelData::AdvanceToAbsPosition((ulonglong)this->mMosi);
        AnalyzerChannelData::GetBitState();
        DataBuilder::AddBit(BVar10);
      }
      if (this->mMiso != (AnalyzerChannelData *)0x0) {
        AnalyzerChannelData::AdvanceToAbsPosition((ulonglong)this->mMiso);
        AnalyzerChannelData::GetBitState();
        DataBuilder::AddBit(BVar11);
      }
      std::vector<unsigned_long_long,_std::allocator<unsigned_long_long>_>::push_back
                (&this->mArrowLocations,&this->mCurrentSample);
    }
  } while( true );
}

Assistant:

void SpiAnalyzer::GetWord()
{
    // we're assuming we come into this function with the clock in the idle state;

    const U32 bits_per_transfer = mSettings->mBitsPerTransfer;
    const U32 bytes_per_transfer = ( bits_per_transfer + 7 ) / 8;

    U64 mosi_word = 0;
    mMosiResult.Reset( &mosi_word, mSettings->mShiftOrder, bits_per_transfer );

    U64 miso_word = 0;
    mMisoResult.Reset( &miso_word, mSettings->mShiftOrder, bits_per_transfer );

    U64 first_sample = 0;
    bool need_reset = false;
    U64 disable_event_sample = 0;


    mArrowLocations.clear();
    ReportProgress( mClock->GetSampleNumber() );

    for( U32 i = 0; i < bits_per_transfer; i++ )
    {
        if( i == 0 )
            CheckIfThreadShouldExit();

        // on every single edge, we need to check that enable doesn't toggle.
        // note that we can't just advance the enable line to the next edge, becuase there may not be another edge

        if( WouldAdvancingTheClockToggleEnable( true, nullptr ) == true )
        {
            AdvanceToActiveEnableEdgeWithCorrectClockPolarity(); // ok, we pretty much need to reset everything and return.
            return;
        }

        mClock->AdvanceToNextEdge();
        if( i == 0 )
            first_sample = mClock->GetSampleNumber();

        if( mSettings->mDataValidEdge == AnalyzerEnums::LeadingEdge )
        {
            mCurrentSample = mClock->GetSampleNumber();
            if( mMosi != NULL )
            {
                mMosi->AdvanceToAbsPosition( mCurrentSample );
                mMosiResult.AddBit( mMosi->GetBitState() );
            }
            if( mMiso != NULL )
            {
                mMiso->AdvanceToAbsPosition( mCurrentSample );
                mMisoResult.AddBit( mMiso->GetBitState() );
            }
            mArrowLocations.push_back( mCurrentSample );
        }


        // ok, the trailing edge is messy -- but only on the very last bit.
        // If the trialing edge isn't doesn't represent valid data, we want to allow the enable line to rise before the clock trialing edge
        // -- and still report the frame
        if( ( i == ( bits_per_transfer - 1 ) ) && ( mSettings->mDataValidEdge != AnalyzerEnums::TrailingEdge ) )
        {
            // if this is the last bit, and the trailing edge doesn't represent valid data
            if( WouldAdvancingTheClockToggleEnable( false, &disable_event_sample ) == true )
            {
                // moving to the trailing edge would cause the clock to revert to inactive.  jump out, record the frame, and them move to
                // the next active enable edge
                need_reset = true;
                break;
            }

            // enable isn't going to go inactive, go ahead and advance the clock as usual.  Then we're done, jump out and record the frame.
            mClock->AdvanceToNextEdge();
            break;
        }

        // this isn't the very last bit, etc, so proceed as normal
        if( WouldAdvancingTheClockToggleEnable( true, nullptr ) == true )
        {
            AdvanceToActiveEnableEdgeWithCorrectClockPolarity(); // ok, we pretty much need to reset everything and return.
            return;
        }

        mClock->AdvanceToNextEdge();

        if( mSettings->mDataValidEdge == AnalyzerEnums::TrailingEdge )
        {
            mCurrentSample = mClock->GetSampleNumber();
            if( mMosi != NULL )
            {
                mMosi->AdvanceToAbsPosition( mCurrentSample );
                mMosiResult.AddBit( mMosi->GetBitState() );
            }
            if( mMiso != NULL )
            {
                mMiso->AdvanceToAbsPosition( mCurrentSample );
                mMisoResult.AddBit( mMiso->GetBitState() );
            }
            mArrowLocations.push_back( mCurrentSample );
        }
    }

    // save the results:
    U32 count = mArrowLocations.size();
    for( U32 i = 0; i < count; i++ )
        mResults->AddMarker( mArrowLocations[ i ], mArrowMarker, mSettings->mClockChannel );

    Frame result_frame;
    result_frame.mStartingSampleInclusive = first_sample;
    result_frame.mEndingSampleInclusive = mClock->GetSampleNumber();
    result_frame.mData1 = mosi_word;
    result_frame.mData2 = miso_word;
    result_frame.mFlags = 0;
    mResults->AddFrame( result_frame );

    FrameV2 framev2;

    // Max bits per transfer == 64, max bytes == 8
    U8 mosi_bytearray[ 8 ];
    U8 miso_bytearray[ 8 ];
    for( int i = 0; i < bytes_per_transfer; ++i )
    {
        auto bit_offset = ( bytes_per_transfer - i - 1 ) * 8;
        mosi_bytearray[ i ] = mosi_word >> bit_offset;
        miso_bytearray[ i ] = miso_word >> bit_offset;
    }
    framev2.AddByteArray( "mosi", mosi_bytearray, bytes_per_transfer );
    framev2.AddByteArray( "miso", miso_bytearray, bytes_per_transfer );

    mResults->AddFrameV2( framev2, "result", first_sample, mClock->GetSampleNumber() + 1 );

    mResults->CommitResults();

    if( need_reset == true )
    {
        FrameV2 frame_v2_end_of_transaction;
        mResults->AddFrameV2( frame_v2_end_of_transaction, "disable", disable_event_sample, disable_event_sample + 1 );
        AdvanceToActiveEnableEdgeWithCorrectClockPolarity();
    }
}